

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldGenerator::GenerateInterfaceMembers
          (RepeatedImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  Options *pOVar3;
  string_view local_148;
  Options local_138;
  string_view local_e8;
  Options local_d8;
  string_view local_88 [2];
  Options local_68;
  Printer *local_18;
  Printer *printer_local;
  RepeatedImmutablePrimitiveFieldGenerator *this_local;
  
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  local_18 = printer;
  printer_local = (Printer *)this;
  pOVar3 = Context::options((this->super_ImmutablePrimitiveFieldGenerator).context_);
  Options::Options(&local_68,pOVar3);
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_GETTER,&local_68,false,false,false);
  Options::~Options(&local_68);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_88,"$deprecation$java.util.List<$boxed_type$> get$capitalized_name$List();\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_88[0]);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pOVar3 = Context::options((this->super_ImmutablePrimitiveFieldGenerator).context_);
  Options::Options(&local_d8,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_COUNT,&local_d8,false,false,false);
  Options::~Options(&local_d8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e8,"$deprecation$int get$capitalized_name$Count();\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_e8);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutablePrimitiveFieldGenerator).descriptor_;
  pOVar3 = Context::options((this->super_ImmutablePrimitiveFieldGenerator).context_);
  Options::Options(&local_138,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_INDEXED_GETTER,&local_138,false,false,false);
  Options::~Options(&local_138);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_148,"$deprecation$$type$ get$capitalized_name$(int index);\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutablePrimitiveFieldGenerator).variables_,local_148);
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER,
                               context_->options());
  printer->Print(variables_,
                 "$deprecation$java.util.List<$boxed_type$> "
                 "get$capitalized_name$List();\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT,
                               context_->options());
  printer->Print(variables_,
                 "$deprecation$int get$capitalized_name$Count();\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER,
                               context_->options());
  printer->Print(variables_,
                 "$deprecation$$type$ get$capitalized_name$(int index);\n");
}